

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall capnp::compiler::NodeTranslator::compileEnum(NodeTranslator *this)

{
  ushort uVar1;
  undefined4 uVar2;
  Reader ordinal;
  Reader annotations;
  undefined4 uVar3;
  PointerType PVar4;
  int iVar5;
  _Base_ptr *pp_Var6;
  _Base_ptr p_Var7;
  WirePointer *pWVar8;
  _Base_ptr p_Var9;
  CapTableReader *pCVar10;
  _Base_ptr p_Var11;
  uint uVar12;
  SegmentBuilder *pSVar13;
  SegmentBuilder *pSVar14;
  ElementCount index;
  ElementCount EVar15;
  SegmentReader *pSVar16;
  Reader RVar17;
  StringPtr targetsFlagName;
  ElementCount in_stack_00000020;
  SegmentBuilder *in_stack_00000038;
  undefined8 in_stack_00000040;
  long in_stack_00000048;
  long in_stack_00000050;
  Builder enumerantBuilder;
  Builder list;
  multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  enumerants;
  DuplicateOrdinalDetector dupDetector;
  Builder sourceInfoList;
  undefined1 local_1f8 [8];
  uint uStack_1f0;
  undefined4 uStack_1ec;
  undefined8 uStack_1e8;
  int local_1e0;
  undefined4 uStack_1dc;
  StructDataBitCount SStack_1d8;
  StructPointerCount local_1d4;
  undefined2 uStack_1d2;
  int iStack_1d0;
  _Base_ptr local_1c0;
  PointerReader local_1b8;
  NodeTranslator *local_198;
  StructBuilder local_190;
  StructReader local_168;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  local_138;
  undefined1 local_108 [16];
  NullableValue<capnp::compiler::LocatedInteger::Reader> NStack_f8;
  StructReader local_c0;
  ListReader local_90;
  StructReader local_60;
  
  EVar15 = in_stack_00000020;
  local_138._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_138._M_impl.super__Rb_tree_header._M_header;
  local_138._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar12 = 0;
  local_138._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_138._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198 = this;
  local_138._M_impl.super__Rb_tree_header._M_header._M_right =
       local_138._M_impl.super__Rb_tree_header._M_header._M_left;
  if (in_stack_00000020 != 0) {
    index = 0;
    do {
      _::ListReader::getStructElement(&local_168,(ListReader *)&stack0x00000008,index);
      if ((0x1f < local_168.dataSize) && (*(short *)((long)local_168.data + 2) == 4)) {
        if (local_168.pointerCount < 2) {
          local_1e0 = 0x7fffffff;
          pCVar10 = (CapTableReader *)0x0;
          pWVar8 = (WirePointer *)0x0;
          pSVar16 = (SegmentReader *)0x0;
        }
        else {
          pWVar8 = local_168.pointers + 1;
          pCVar10 = local_168.capTable;
          pSVar16 = local_168.segment;
          local_1e0 = local_168.nestingLimit;
        }
        local_1f8._0_4_ = SUB84(pSVar16,0);
        local_1f8._4_4_ = (undefined4)((ulong)pSVar16 >> 0x20);
        uStack_1f0 = (uint)pCVar10;
        uStack_1ec = (undefined4)((ulong)pCVar10 >> 0x20);
        uStack_1e8._0_4_ = SUB84(pWVar8,0);
        uStack_1e8._4_4_ = (StructDataBitCount)((ulong)pWVar8 >> 0x20);
        _::PointerReader::getStruct(&local_c0,(PointerReader *)local_1f8,(word *)0x0);
        if (local_c0.dataSize < 0x40) {
          local_108._0_8_ = (SegmentBuilder *)0x0;
        }
        else {
          local_108._0_8_ = *local_c0.data;
        }
        local_1d4 = (StructPointerCount)local_168.dataSize;
        uStack_1d2 = (undefined2)(local_168.dataSize >> 0x10);
        iStack_1d0 = (int)(CONCAT26(local_168._38_2_,
                                    CONCAT24(local_168.pointerCount,local_168.dataSize)) >> 0x20);
        uStack_1e8._4_4_ = (StructDataBitCount)local_168.data;
        local_1e0 = (int)((ulong)local_168.data >> 0x20);
        uStack_1dc = SUB84(local_168.pointers,0);
        SStack_1d8 = (StructDataBitCount)((ulong)local_168.pointers >> 0x20);
        local_1f8._4_4_ = SUB84(local_168.segment,0);
        uStack_1f0 = (uint)((ulong)local_168.segment >> 0x20);
        uStack_1ec = SUB84(local_168.capTable,0);
        uStack_1e8._0_4_ = (undefined4)((ulong)local_168.capTable >> 0x20);
        NStack_f8.field_1._36_4_ = local_168._44_4_;
        NStack_f8.field_1._16_4_ = uStack_1dc;
        NStack_f8.field_1._12_4_ = local_1e0;
        NStack_f8.field_1._24_2_ = local_1d4;
        NStack_f8.field_1._20_4_ = SStack_1d8;
        NStack_f8.field_1._26_2_ = uStack_1d2;
        NStack_f8.field_1._32_4_ = local_168.nestingLimit;
        NStack_f8.field_1._28_4_ = iStack_1d0;
        NStack_f8.field_1._4_4_ = (undefined4)uStack_1e8;
        NStack_f8.field_1._8_4_ = uStack_1e8._4_4_;
        local_108._12_4_ = local_1f8._0_4_;
        NStack_f8._0_4_ = local_1f8._4_4_;
        NStack_f8._4_4_ = uStack_1f0;
        NStack_f8.field_1._0_4_ = uStack_1ec;
        local_108._8_4_ = uVar12;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>>
        ::
        _M_emplace_equal<std::pair<unsigned_long,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>>
                    *)&local_138,
                   (pair<unsigned_long,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>
                    *)local_108);
        uVar12 = uVar12 + 1;
      }
      index = index + 1;
    } while (EVar15 != index);
  }
  pSVar13 = in_stack_00000038;
  *(undefined2 *)(in_stack_00000048 + 0xc) = 2;
  pSVar16 = (SegmentReader *)(in_stack_00000050 + 0x18);
  local_108._0_8_ = in_stack_00000038;
  local_108._8_4_ = (undefined4)in_stack_00000040;
  uVar2 = local_108._8_4_;
  local_108._12_4_ = (undefined4)((ulong)in_stack_00000040 >> 0x20);
  uVar3 = local_108._12_4_;
  NStack_f8._0_8_ = pSVar16;
  _::PointerBuilder::clear((PointerBuilder *)local_108);
  local_108._0_8_ = pSVar13;
  local_108._8_4_ = uVar2;
  local_108._12_4_ = uVar3;
  NStack_f8._0_8_ = pSVar16;
  _::PointerBuilder::initStructList
            ((ListBuilder *)&local_168,(PointerBuilder *)local_108,
             (ElementCount)local_138._M_impl.super__Rb_tree_header._M_node_count,(StructSize)0x20001
            );
  _::OrphanBuilder::asStruct
            ((StructBuilder *)local_108,&(local_198->sourceInfo).builder,(StructSize)0x20001);
  uStack_1e8 = (_Base_ptr)(CONCAT44(NStack_f8.field_1._4_4_,NStack_f8.field_1._0_4_) + 8);
  local_1f8._0_4_ = (undefined4)local_108._0_8_;
  local_1f8._4_4_ = SUB84(local_108._0_8_,4);
  uStack_1f0 = local_108._8_4_;
  uStack_1ec = local_108._12_4_;
  _::PointerBuilder::initStructList
            ((ListBuilder *)&local_c0,(PointerBuilder *)local_1f8,
             (ElementCount)local_138._M_impl.super__Rb_tree_header._M_node_count,(StructSize)0x10000
            );
  local_108._0_8_ = local_198->errorReporter;
  local_108._8_4_ = 0;
  NStack_f8._0_4_ = NStack_f8._0_4_ & 0xffffff00;
  if ((_Rb_tree_header *)local_138._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_138._M_impl.super__Rb_tree_header) {
    EVar15 = 0;
    p_Var7 = local_138._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pSVar13 = (SegmentBuilder *)p_Var7[1]._M_left;
      local_1c0 = p_Var7[1]._M_right;
      p_Var9 = p_Var7[2]._M_parent;
      uVar1 = *(ushort *)((long)&p_Var7[2]._M_left + 4);
      iVar5 = *(int *)&p_Var7[2]._M_right;
      if (uVar1 < 2) {
        local_1e0 = 0x7fffffff;
        p_Var11 = (_Base_ptr)0x0;
        pp_Var6 = (_Base_ptr *)0x0;
        pSVar14 = (SegmentBuilder *)0x0;
      }
      else {
        pp_Var6 = &p_Var9->_M_parent;
        p_Var11 = local_1c0;
        pSVar14 = pSVar13;
        local_1e0 = iVar5;
      }
      uVar2 = *(undefined4 *)&p_Var7[1]._M_parent;
      local_1f8._0_4_ = SUB84(pSVar14,0);
      local_1f8._4_4_ = (undefined4)((ulong)pSVar14 >> 0x20);
      uStack_1f0 = (uint)p_Var11;
      uStack_1ec = (undefined4)((ulong)p_Var11 >> 0x20);
      uStack_1e8._0_4_ = SUB84(pp_Var6,0);
      uStack_1e8._4_4_ = (StructDataBitCount)((ulong)pp_Var6 >> 0x20);
      _::PointerReader::getStruct(&local_60,(PointerReader *)local_1f8,(word *)0x0);
      ordinal._reader.capTable = local_60.capTable;
      ordinal._reader.segment = local_60.segment;
      ordinal._reader.data = local_60.data;
      ordinal._reader.pointers = local_60.pointers;
      ordinal._reader.dataSize = local_60.dataSize;
      ordinal._reader.pointerCount = local_60.pointerCount;
      ordinal._reader._38_2_ = local_60._38_2_;
      ordinal._reader.nestingLimit = local_60.nestingLimit;
      ordinal._reader._44_4_ = local_60._44_4_;
      DuplicateOrdinalDetector::check((DuplicateOrdinalDetector *)local_108,ordinal);
      if (uVar1 < 5) {
        local_1f8._0_4_ = 0;
        local_1f8._4_4_ = 0;
        uStack_1f0 = 0;
        uStack_1ec = 0;
        uStack_1e8 = (_Base_ptr)0x0;
        local_1e0 = 0x7fffffff;
      }
      else {
        uStack_1e8 = p_Var9 + 1;
        local_1f8._0_4_ = SUB84(pSVar13,0);
        local_1f8._4_4_ = (undefined4)((ulong)pSVar13 >> 0x20);
        uStack_1f0 = (uint)local_1c0;
        uStack_1ec = (undefined4)((ulong)local_1c0 >> 0x20);
        local_1e0 = iVar5;
      }
      PVar4 = _::PointerReader::getPointerType((PointerReader *)local_1f8);
      if (PVar4 != NULL_) {
        _::ListBuilder::getStructElement((StructBuilder *)local_1f8,(ListBuilder *)&local_c0,EVar15)
        ;
        if (uVar1 < 5) {
          local_190.pointers._0_4_ = 0x7fffffff;
          local_190.capTable = (CapTableBuilder *)0x0;
          local_190.data = (_Base_ptr)0x0;
          local_190.segment = (SegmentBuilder *)0x0;
        }
        else {
          local_190.data = p_Var9 + 1;
          local_190.capTable = (CapTableBuilder *)local_1c0;
          local_190.segment = pSVar13;
          local_190.pointers._0_4_ = iVar5;
        }
        RVar17 = _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_190,(void *)0x0,0);
        local_190.segment = (SegmentBuilder *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
        local_190.capTable = (CapTableBuilder *)CONCAT44(uStack_1ec,uStack_1f0);
        local_190.data = (void *)CONCAT44(uStack_1dc,local_1e0);
        _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_190,RVar17);
      }
      _::ListBuilder::getStructElement(&local_190,(ListBuilder *)&local_168,EVar15);
      local_1b8.capTable = (CapTableReader *)local_1c0;
      local_1b8.pointer = (WirePointer *)p_Var9;
      local_1b8.segment = (SegmentReader *)pSVar13;
      local_1b8.nestingLimit = iVar5;
      if (uVar1 == 0) {
        local_1b8.capTable = (CapTableReader *)(_Base_ptr)0x0;
        local_1b8.pointer = (WirePointer *)(_Base_ptr)0x0;
        local_1b8.segment = &((SegmentBuilder *)0x0)->super_SegmentReader;
        local_1b8.nestingLimit = 0x7fffffff;
      }
      _::PointerReader::getStruct((StructReader *)local_1f8,&local_1b8,(word *)0x0);
      if (local_1d4 == 0) {
        local_1b8.nestingLimit = 0x7fffffff;
        local_1b8.capTable = (CapTableReader *)0x0;
        local_1b8.pointer = (WirePointer *)0x0;
        local_1b8.segment = (SegmentReader *)0x0;
      }
      else {
        local_1b8.segment = (SegmentReader *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_);
        local_1b8.capTable = (CapTableReader *)CONCAT44(uStack_1ec,uStack_1f0);
        local_1b8.pointer = (WirePointer *)CONCAT44(uStack_1dc,local_1e0);
        local_1b8.nestingLimit = iStack_1d0;
      }
      RVar17 = _::PointerReader::getBlob<capnp::Text>(&local_1b8,(void *)0x0,0);
      local_1b8.pointer = (WirePointer *)CONCAT44(local_190.pointers._4_4_,(int)local_190.pointers);
      local_1b8.segment = &(local_190.segment)->super_SegmentReader;
      local_1b8.capTable = &(local_190.capTable)->super_CapTableReader;
      _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1b8,RVar17);
      *(short *)local_190.data = (short)uVar2;
      if (uVar1 < 4) {
        iVar5 = 0x7fffffff;
        p_Var9 = (_Base_ptr)0x0;
        pp_Var6 = (_Base_ptr *)0x0;
        pSVar13 = (SegmentBuilder *)0x0;
      }
      else {
        pp_Var6 = &p_Var9->_M_right;
        p_Var9 = local_1c0;
      }
      local_1f8._0_4_ = SUB84(pSVar13,0);
      local_1f8._4_4_ = (undefined4)((ulong)pSVar13 >> 0x20);
      uStack_1f0 = (uint)p_Var9;
      uStack_1ec = (undefined4)((ulong)p_Var9 >> 0x20);
      uStack_1e8._0_4_ = SUB84(pp_Var6,0);
      uStack_1e8._4_4_ = (StructDataBitCount)((ulong)pp_Var6 >> 0x20);
      local_1e0 = iVar5;
      _::PointerReader::getList(&local_90,(PointerReader *)local_1f8,INLINE_COMPOSITE,(word *)0x0);
      annotations.reader.capTable = local_90.capTable;
      annotations.reader.segment = local_90.segment;
      annotations.reader.ptr = local_90.ptr;
      annotations.reader.elementCount = local_90.elementCount;
      annotations.reader.step = local_90.step;
      annotations.reader.structDataSize = local_90.structDataSize;
      annotations.reader.structPointerCount = local_90.structPointerCount;
      annotations.reader.elementSize = local_90.elementSize;
      annotations.reader._39_1_ = local_90._39_1_;
      annotations.reader.nestingLimit = local_90.nestingLimit;
      annotations.reader._44_4_ = local_90._44_4_;
      targetsFlagName.content.size_ = 0x11;
      targetsFlagName.content.ptr = "targetsEnumerant";
      compileAnnotationApplications
                ((Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)&local_1b8,
                 local_198,annotations,targetsFlagName);
      uStack_1e8 = (_Base_ptr)(CONCAT44(local_190.pointers._4_4_,(int)local_190.pointers) + 8);
      local_1f8._0_4_ = SUB84(local_190.segment,0);
      local_1f8._4_4_ = (undefined4)((ulong)local_190.segment >> 0x20);
      uStack_1f0 = (uint)local_190.capTable;
      uStack_1ec = (undefined4)((ulong)local_190.capTable >> 0x20);
      _::PointerBuilder::adopt((PointerBuilder *)local_1f8,(OrphanBuilder *)&local_1b8);
      if (local_1b8.capTable != (CapTableReader *)0x0) {
        _::OrphanBuilder::euthanize((OrphanBuilder *)&local_1b8);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      EVar15 = EVar15 + 1;
    } while ((_Rb_tree_header *)p_Var7 != &local_138._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  ::~_Rb_tree(&local_138);
  return;
}

Assistant:

void NodeTranslator::compileEnum(Void decl,
                                 List<Declaration>::Reader members,
                                 schema::Node::Builder builder) {
  // maps ordinal -> (code order, declaration)
  std::multimap<uint, std::pair<uint, Declaration::Reader>> enumerants;

  uint codeOrder = 0;
  for (auto member: members) {
    if (member.isEnumerant()) {
      enumerants.insert(
          std::make_pair(member.getId().getOrdinal().getValue(),
                         std::make_pair(codeOrder++, member)));
    }
  }

  auto list = builder.initEnum().initEnumerants(enumerants.size());
  auto sourceInfoList = sourceInfo.get().initMembers(enumerants.size());
  uint i = 0;
  DuplicateOrdinalDetector dupDetector(errorReporter);

  for (auto& entry: enumerants) {
    uint codeOrder = entry.second.first;
    Declaration::Reader enumerantDecl = entry.second.second;

    dupDetector.check(enumerantDecl.getId().getOrdinal());

    if (enumerantDecl.hasDocComment()) {
      sourceInfoList[i].setDocComment(enumerantDecl.getDocComment());
    }

    auto enumerantBuilder = list[i++];
    enumerantBuilder.setName(enumerantDecl.getName().getValue());
    enumerantBuilder.setCodeOrder(codeOrder);
    enumerantBuilder.adoptAnnotations(compileAnnotationApplications(
        enumerantDecl.getAnnotations(), "targetsEnumerant"));
  }
}